

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionKernel
          (ValidationState_t *_,Instruction *inst,uint32_t version)

{
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *this;
  bool bVar1;
  bool bVar2;
  __type _Var3;
  Op OVar4;
  uint id;
  DiagnosticStream *pDVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  reference puVar6;
  reference pEVar7;
  Instruction *this_01;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *this_02;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this_03;
  Instruction *in_RCX;
  DiagnosticStream local_1388;
  uint local_11ac;
  undefined1 local_11a8 [4];
  uint atts_id;
  uint local_fcc;
  undefined1 local_fc8 [4];
  uint flags_id;
  uint local_dec;
  undefined1 local_de8 [4];
  uint num_args_id;
  size_type local_c10;
  size_type num_operands;
  reference local_a30;
  EntryPointDescription *desc;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *__range2_2;
  undefined1 local_a08 [7];
  bool found;
  string name_str;
  Instruction *name;
  ExecutionModel local_62c;
  iterator iStack_628;
  ExecutionModel exec_model;
  iterator __end2_1;
  iterator __begin2_1;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *__range2_1;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *local_438;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *exec_models;
  uint local_254;
  const_iterator cStack_250;
  uint entry_point;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  undefined1 local_230 [3];
  bool found_kernel;
  Instruction *local_58;
  Instruction *kernel;
  undefined1 local_48 [4];
  uint kernel_id;
  string inst_name;
  uint32_t version_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  inst_name.field_2._12_4_ = version;
  (anonymous_namespace)::ReflectionInstructionName_abi_cxx11_
            ((string *)local_48,(_anonymous_namespace_ *)_,(ValidationState_t *)inst,in_RCX);
  kernel._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,4);
  local_58 = ValidationState_t::FindDef(_,kernel._4_4_);
  OVar4 = Instruction::opcode(local_58);
  if (OVar4 != OpFunction) {
    ValidationState_t::diag((DiagnosticStream *)local_230,_,SPV_ERROR_INVALID_ID,inst);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_230,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_48);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [31])" does not reference a function");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_230);
    goto LAB_00560362;
  }
  bVar2 = false;
  this_00 = ValidationState_t::entry_points(_);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
  cStack_250 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffdb0), bVar1) {
    puVar6 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    local_254 = *puVar6;
    if (local_254 == kernel._4_4_) {
      bVar2 = true;
      break;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  if (!bVar2) {
    ValidationState_t::diag((DiagnosticStream *)&exec_models,_,SPV_ERROR_INVALID_ID,inst);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&exec_models,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_48);
    pDVar5 = DiagnosticStream::operator<<
                       (pDVar5,(char (*) [35])" does not reference an entry-point");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&exec_models);
    goto LAB_00560362;
  }
  local_438 = ValidationState_t::GetExecutionModels(_,kernel._4_4_);
  if ((local_438 ==
       (set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
        *)0x0) ||
     (bVar2 = std::
              set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
              ::empty(local_438), this = local_438, bVar2)) {
    ValidationState_t::diag((DiagnosticStream *)&__range2_1,_,SPV_ERROR_INVALID_ID,inst);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&__range2_1,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_48);
    pDVar5 = DiagnosticStream::operator<<
                       (pDVar5,(char (*) [35])" does not reference an entry-point");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&__range2_1);
    goto LAB_00560362;
  }
  __end2_1 = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::begin(local_438);
  iStack_628 = std::
               set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
               ::end(this);
  while (bVar2 = std::operator!=(&__end2_1,&stack0xfffffffffffff9d8), bVar2) {
    pEVar7 = std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator*(&__end2_1);
    local_62c = *pEVar7;
    if (local_62c != GLCompute) {
      ValidationState_t::diag((DiagnosticStream *)&name,_,SPV_ERROR_INVALID_ID,inst);
      pDVar5 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&name,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48);
      pDVar5 = DiagnosticStream::operator<<
                         (pDVar5,(char (*) [43])" must refer only to GLCompute entry-points");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&name);
      goto LAB_00560362;
    }
    std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator++(&__end2_1);
  }
  id = Instruction::GetOperandAs<unsigned_int>(inst,5);
  this_01 = ValidationState_t::FindDef(_,id);
  if ((this_01 == (Instruction *)0x0) || (OVar4 = Instruction::opcode(this_01), OVar4 != OpString))
  {
    ValidationState_t::diag
              ((DiagnosticStream *)((long)&name_str.field_2 + 8),_,SPV_ERROR_INVALID_ID,inst);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)((long)&name_str.field_2 + 8),(char (*) [25])0x62a5de);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)((long)&name_str.field_2 + 8));
    goto LAB_00560362;
  }
  Instruction::GetOperandAs<std::__cxx11::string>((string *)local_a08,this_01,1);
  bVar2 = false;
  this_02 = ValidationState_t::entry_point_descriptions(_,kernel._4_4_);
  __end2_2 = std::
             vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
             ::begin(this_02);
  desc = (EntryPointDescription *)
         std::
         vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
         ::end(this_02);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
                             *)&desc), bVar1) {
    local_a30 = __gnu_cxx::
                __normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
                ::operator*(&__end2_2);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a08,&local_a30->name);
    if (_Var3) {
      bVar2 = true;
      break;
    }
    __gnu_cxx::
    __normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
    ::operator++(&__end2_2);
  }
  if (bVar2) {
    this_03 = Instruction::operands(inst);
    local_c10 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                          (this_03);
    if (((uint)inst_name.field_2._12_4_ < 5) && (6 < local_c10)) {
      ValidationState_t::diag((DiagnosticStream *)local_de8,_,SPV_ERROR_INVALID_ID,inst);
      pDVar5 = DiagnosticStream::operator<<((DiagnosticStream *)local_de8,(char (*) [9])"Version ");
      pDVar5 = DiagnosticStream::operator<<(pDVar5,(uint *)(inst_name.field_2._M_local_buf + 0xc));
      pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [9])" of the ");
      pDVar5 = DiagnosticStream::operator<<
                         (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_48);
      pDVar5 = DiagnosticStream::operator<<
                         (pDVar5,(char (*) [49])" instruction can only have 2 additional operands");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_de8);
    }
    else {
      if (6 < local_c10) {
        local_dec = Instruction::GetOperandAs<unsigned_int>(inst,6);
        bVar2 = IsUint32Constant(_,local_dec);
        if (!bVar2) {
          ValidationState_t::diag((DiagnosticStream *)local_fc8,_,SPV_ERROR_INVALID_ID,inst);
          pDVar5 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)local_fc8,
                              (char (*) [58])
                              "NumArguments must be a 32-bit unsigned integer OpConstant");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_fc8);
          goto LAB_00560356;
        }
      }
      if (7 < local_c10) {
        local_fcc = Instruction::GetOperandAs<unsigned_int>(inst,7);
        bVar2 = IsUint32Constant(_,local_fcc);
        if (!bVar2) {
          ValidationState_t::diag((DiagnosticStream *)local_11a8,_,SPV_ERROR_INVALID_ID,inst);
          pDVar5 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)local_11a8,
                              (char (*) [51])"Flags must be a 32-bit unsigned integer OpConstant");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_11a8);
          goto LAB_00560356;
        }
      }
      if (8 < local_c10) {
        local_11ac = Instruction::GetOperandAs<unsigned_int>(inst,8);
        OVar4 = ValidationState_t::GetIdOpcode(_,local_11ac);
        if (OVar4 != OpString) {
          ValidationState_t::diag(&local_1388,_,SPV_ERROR_INVALID_ID,inst);
          pDVar5 = DiagnosticStream::operator<<
                             (&local_1388,(char (*) [31])"Attributes must be an OpString");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
          DiagnosticStream::~DiagnosticStream(&local_1388);
          goto LAB_00560356;
        }
      }
      __local._4_4_ = SPV_SUCCESS;
    }
  }
  else {
    ValidationState_t::diag((DiagnosticStream *)&num_operands,_,SPV_ERROR_INVALID_ID,inst);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&num_operands,
                        (char (*) [42])"Name must match an entry-point for Kernel");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&num_operands);
  }
LAB_00560356:
  std::__cxx11::string::~string((string *)local_a08);
LAB_00560362:
  std::__cxx11::string::~string((string *)local_48);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateClspvReflectionKernel(ValidationState_t& _,
                                           const Instruction* inst,
                                           uint32_t version) {
  const auto inst_name = ReflectionInstructionName(_, inst);
  const auto kernel_id = inst->GetOperandAs<uint32_t>(4);
  const auto kernel = _.FindDef(kernel_id);
  if (kernel->opcode() != spv::Op::OpFunction) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << inst_name << " does not reference a function";
  }

  bool found_kernel = false;
  for (auto entry_point : _.entry_points()) {
    if (entry_point == kernel_id) {
      found_kernel = true;
      break;
    }
  }
  if (!found_kernel) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << inst_name << " does not reference an entry-point";
  }

  const auto* exec_models = _.GetExecutionModels(kernel_id);
  if (!exec_models || exec_models->empty()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << inst_name << " does not reference an entry-point";
  }
  for (auto exec_model : *exec_models) {
    if (exec_model != spv::ExecutionModel::GLCompute) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << inst_name << " must refer only to GLCompute entry-points";
    }
  }

  auto name = _.FindDef(inst->GetOperandAs<uint32_t>(5));
  if (!name || name->opcode() != spv::Op::OpString) {
    return _.diag(SPV_ERROR_INVALID_ID, inst) << "Name must be an OpString";
  }

  const std::string name_str = name->GetOperandAs<std::string>(1);
  bool found = false;
  for (auto& desc : _.entry_point_descriptions(kernel_id)) {
    if (name_str == desc.name) {
      found = true;
      break;
    }
  }
  if (!found) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Name must match an entry-point for Kernel";
  }

  const auto num_operands = inst->operands().size();
  if (version < 5 && num_operands > 6) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Version " << version << " of the " << inst_name
           << " instruction can only have 2 additional operands";
  }

  if (num_operands > 6) {
    const auto num_args_id = inst->GetOperandAs<uint32_t>(6);
    if (!IsUint32Constant(_, num_args_id)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NumArguments must be a 32-bit unsigned integer OpConstant";
    }
  }

  if (num_operands > 7) {
    const auto flags_id = inst->GetOperandAs<uint32_t>(7);
    if (!IsUint32Constant(_, flags_id)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Flags must be a 32-bit unsigned integer OpConstant";
    }
  }

  if (num_operands > 8) {
    const auto atts_id = inst->GetOperandAs<uint32_t>(8);
    if (_.GetIdOpcode(atts_id) != spv::Op::OpString) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Attributes must be an OpString";
    }
  }

  return SPV_SUCCESS;
}